

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O3

void anon_unknown.dwarf_1fbbc6::fillHeaderTrailer(Message *message)

{
  undefined1 *this;
  long *local_c0;
  long local_b8;
  long alStack_b0 [2];
  undefined1 local_a0 [16];
  _Alloc_hider local_90;
  char local_80 [16];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  field_metrics local_50;
  UtcTimeStamp local_48;
  
  this = &message->field_0x70;
  FIX::IntField::IntField((IntField *)local_a0,9,0);
  local_a0._0_8_ = &PTR__FieldBase_003253c8;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)local_a0,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_a0);
  local_c0 = alStack_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"FIXTEST","");
  local_a0._0_8_ = &PTR__FieldBase_00320f80;
  local_a0._8_4_ = 0x31;
  local_90._M_p = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_c0,local_b8 + (long)local_c0);
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50.m_length = 0;
  local_50.m_checksum = 0;
  local_a0._0_8_ = &PTR__FieldBase_00325010;
  local_70._M_p = (pointer)&local_60;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)local_a0,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_a0);
  if (local_c0 != alStack_b0) {
    operator_delete(local_c0,alStack_b0[0] + 1);
  }
  local_c0 = alStack_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"TW","");
  local_a0._0_8_ = &PTR__FieldBase_00320f80;
  local_a0._8_4_ = 0x38;
  local_90._M_p = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_c0,local_b8 + (long)local_c0);
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50.m_length = 0;
  local_50.m_checksum = 0;
  local_a0._0_8_ = &PTR__FieldBase_00325400;
  local_70._M_p = (pointer)&local_60;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)local_a0,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_a0);
  if (local_c0 != alStack_b0) {
    operator_delete(local_c0,alStack_b0[0] + 1);
  }
  FIX::UInt64Field::UInt64Field((UInt64Field *)local_a0,0x22,1);
  local_a0._0_8_ = &PTR__FieldBase_00325438;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)local_a0,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_a0);
  FIX::DateTime::nowUtc();
  local_48.super_DateTime._8_8_ = local_b8;
  local_48.super_DateTime.m_time = alStack_b0[0];
  local_48.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_003254a8;
  FIX::UtcTimeStampField::UtcTimeStampField((UtcTimeStampField *)local_a0,0x34,&local_48,0);
  local_a0._0_8_ = &PTR__FieldBase_003254f0;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)local_a0,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_a0);
  FIX::CheckSumField::CheckSumField((CheckSumField *)local_a0,10,0);
  local_a0._0_8_ = &PTR__FieldBase_00325560;
  FIX::FieldMap::setField((FieldMap *)&message->field_0xe0,(FieldBase *)local_a0,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_a0);
  return;
}

Assistant:

static void fillHeaderTrailer(FIX44::Message &message) {
  message.getHeader().set(FIX::BodyLength(0));
  message.getHeader().set(SenderCompID("FIXTEST"));
  message.getHeader().set(TargetCompID("TW"));
  message.getHeader().set(MsgSeqNum(1));
  message.getHeader().set(SendingTime(UtcTimeStamp::now()));
  message.getTrailer().set(CheckSum(0));
}